

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O3

string * __thiscall
adios2::Remote::GetKeyFromConnectionManager
          (string *__return_storage_ptr__,Remote *this,string *keyID)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  char *__s1;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  NetworkSocket socket;
  string *keyhex;
  char *value;
  char *rest;
  string request;
  char response [2048];
  allocator local_961;
  NetworkSocket local_960;
  string *local_958;
  char *local_950;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  char *local_8c8;
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8a0;
  string local_898;
  string local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  char local_838 [2056];
  
  local_958 = __return_storage_ptr__;
  helper::NetworkSocket::NetworkSocket(&local_960);
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"localhost","");
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"tcp","");
  helper::NetworkSocket::Connect(&local_960,&local_878,30000,&local_898);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  std::operator+(&local_858,"/get_key?id=",keyID);
  helper::NetworkSocket::RequestResponse(&local_960,&local_858,local_838,0x800);
  local_8a0 = &local_958->field_2;
  (local_958->_M_dataplus)._M_p = (pointer)local_8a0;
  local_958->_M_string_length = 0;
  (local_958->field_2)._M_local_buf[0] = '\0';
  local_8c8 = local_838;
  pcVar3 = strtok_r(local_838,",",&local_8c8);
  if (pcVar3 != (char *)0x0) {
    paVar1 = &local_948.field_2;
    do {
      local_950 = pcVar3;
      __s1 = strtok_r(pcVar3,":",&local_950);
      iVar2 = strncmp(__s1,"port",4);
      pcVar3 = local_950;
      if (iVar2 != 0) {
        if (*__s1 == 'm') {
          if ((__s1[1] != 's') || (__s1[2] != 'g')) goto LAB_00632b80;
          iVar2 = strcmp(local_950,"no_error");
          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar3,"cannot_find_key_id"), iVar2 == 0))
          goto LAB_00632cd5;
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"Toolkit","");
          local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"Remote","");
          local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"GetKey","");
          std::__cxx11::string::string((string *)local_8c0,local_950,&local_961);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)local_8c0,0,(char *)0x0,0x74d694);
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_948.field_2._M_allocated_capacity = *psVar6;
            local_948.field_2._8_8_ = plVar4[3];
            local_948._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_948.field_2._M_allocated_capacity = *psVar6;
            local_948._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_948._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          helper::Throw<std::invalid_argument>(&local_928,&local_8e8,&local_908,&local_948,-1);
LAB_00632c6a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_948._M_dataplus._M_p != paVar1) {
            operator_delete(local_948._M_dataplus._M_p);
          }
          if (local_8c0[0] != local_8b0) {
            operator_delete(local_8c0[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_908._M_dataplus._M_p != &local_908.field_2) {
            operator_delete(local_908._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
            operator_delete(local_8e8._M_dataplus._M_p);
          }
        }
        else {
          if (((*__s1 != 'k') || (__s1[1] != 'e')) || (__s1[2] != 'y')) {
LAB_00632b80:
            local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"Toolkit","");
            local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"Remote","");
            local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_908,"EstablishConnection","");
            std::__cxx11::string::string((string *)local_8c0,__s1,&local_961);
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_8c0,0,(char *)0x0,0x74d6bd);
            psVar6 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_948.field_2._M_allocated_capacity = *psVar6;
              local_948.field_2._8_8_ = puVar5[3];
              local_948._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_948.field_2._M_allocated_capacity = *psVar6;
              local_948._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_948._M_string_length = puVar5[1];
            *puVar5 = psVar6;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            helper::Throw<std::invalid_argument>(&local_928,&local_8e8,&local_908,&local_948,-1);
            goto LAB_00632c6a;
          }
          std::__cxx11::string::string((string *)&local_928,local_950,(allocator *)&local_8e8);
          std::__cxx11::string::operator=((string *)local_958,(string *)&local_928);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p);
        }
      }
LAB_00632cd5:
      pcVar3 = strtok_r(local_8c8,",",&local_8c8);
    } while (pcVar3 != (char *)0x0);
  }
  helper::NetworkSocket::Close(&local_960);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  helper::NetworkSocket::~NetworkSocket(&local_960);
  return local_958;
}

Assistant:

std::string Remote::GetKeyFromConnectionManager(const std::string keyID)
{
    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);
    std::string request = "/get_key?id=" + keyID;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   "port:-1,msg:incomplete_service_definition
    //   "key:0,msg:missing_key_id_in_request"
    //   "key:0,msg:cannot_find_key_id"
    //   "key:5980a49cb5e0c4a6042f73f7ce0277d3a577e1af9cfc530e4f5683a615815d6a,msg:no_error"

    char *token;
    char *rest = response;

    std::string keyhex;

    // std::cout << "Response from Connection manager = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            ; // we don't care about port, msg will throw the error message
        }
        else if (!strncmp(key, "key", 3))
        {
            keyhex = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error") && strcmp(value, "cannot_find_key_id"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "GetKey",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return keyhex;
}